

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O3

void __thiscall fasttext::Args::dump(Args *this,ostream *out)

{
  long *plVar1;
  ostream *poVar2;
  Args *pAVar3;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"dim",3);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  plVar1 = (long *)std::ostream::operator<<((ostream *)out,this->dim);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"ws",2);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  plVar1 = (long *)std::ostream::operator<<((ostream *)out,this->ws);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"epoch",5);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  plVar1 = (long *)std::ostream::operator<<((ostream *)out,this->epoch);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"minCount",8);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  plVar1 = (long *)std::ostream::operator<<((ostream *)out,this->minCount);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"neg",3);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  plVar1 = (long *)std::ostream::operator<<((ostream *)out,this->neg);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"wordNgrams",10);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  plVar1 = (long *)std::ostream::operator<<((ostream *)out,this->wordNgrams);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"loss",4);
  pAVar3 = (Args *)0x146a82;
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  lossToString_abi_cxx11_(&local_40,pAVar3,this->loss);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"model",5);
  pAVar3 = (Args *)0x146a82;
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  modelToString_abi_cxx11_(&local_40,pAVar3,this->model);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"bucket",6);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  plVar1 = (long *)std::ostream::operator<<((ostream *)out,this->bucket);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"minn",4);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  plVar1 = (long *)std::ostream::operator<<((ostream *)out,this->minn);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"maxn",4);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  plVar1 = (long *)std::ostream::operator<<((ostream *)out,this->maxn);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"lrUpdateRate",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  plVar1 = (long *)std::ostream::operator<<((ostream *)out,this->lrUpdateRate);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"t",1);
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  poVar2 = std::ostream::_M_insert<double>(this->t);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Args::dump(std::ostream& out) const {
  out << "dim"
      << " " << dim << std::endl;
  out << "ws"
      << " " << ws << std::endl;
  out << "epoch"
      << " " << epoch << std::endl;
  out << "minCount"
      << " " << minCount << std::endl;
  out << "neg"
      << " " << neg << std::endl;
  out << "wordNgrams"
      << " " << wordNgrams << std::endl;
  out << "loss"
      << " " << lossToString(loss) << std::endl;
  out << "model"
      << " " << modelToString(model) << std::endl;
  out << "bucket"
      << " " << bucket << std::endl;
  out << "minn"
      << " " << minn << std::endl;
  out << "maxn"
      << " " << maxn << std::endl;
  out << "lrUpdateRate"
      << " " << lrUpdateRate << std::endl;
  out << "t"
      << " " << t << std::endl;
}